

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O0

void csp_sha1_compress(csp_sha1_state_t *sha1,uint8_t *buf)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_RSI;
  long in_RDI;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint local_16c;
  uint auStack_168 [61];
  uint32_t i;
  uint auStack_70 [22];
  uint local_18;
  uint local_14;
  
  for (local_16c = 0; local_16c < 0x10; local_16c = local_16c + 1) {
    auStack_168[local_16c] =
         (uint)*(byte *)(in_RSI + (ulong)(local_16c << 2)) << 0x18 |
         (uint)*(byte *)(in_RSI + 1 + (ulong)(local_16c << 2)) << 0x10 |
         (uint)*(byte *)(in_RSI + 2 + (ulong)(local_16c << 2)) << 8 |
         (uint)*(byte *)(in_RSI + 3 + (ulong)(local_16c << 2));
  }
  local_14 = *(uint *)(in_RDI + 8);
  local_18 = *(uint *)(in_RDI + 0xc);
  auStack_70[0x15] = *(uint *)(in_RDI + 0x10);
  auStack_70[0x14] = *(uint *)(in_RDI + 0x14);
  auStack_70[0x13] = *(uint *)(in_RDI + 0x18);
  for (local_16c = 0x10; local_16c < 0x50; local_16c = local_16c + 1) {
    auStack_168[local_16c] =
         (auStack_168[local_16c - 3] ^ auStack_168[local_16c - 8] ^ auStack_168[local_16c - 0xe] ^
         auStack_168[local_16c - 0x10]) << 1 |
         (auStack_168[local_16c - 3] ^ auStack_168[local_16c - 8] ^ auStack_168[local_16c - 0xe] ^
         auStack_168[local_16c - 0x10]) >> 0x1f;
  }
  for (local_16c = 0; local_16c < 0x14; local_16c = local_16c + 5) {
    auStack_70[0x13] =
         (local_14 << 5 | local_14 >> 0x1b) +
         (auStack_70[0x14] ^ local_18 & (auStack_70[0x15] ^ auStack_70[0x14])) + auStack_70[0x13] +
         auStack_168[local_16c] + 0x5a827999;
    uVar1 = local_18 << 0x1e | local_18 >> 2;
    auStack_70[0x14] =
         (auStack_70[0x13] * 0x20 | auStack_70[0x13] >> 0x1b) +
         (auStack_70[0x15] ^ local_14 & (uVar1 ^ auStack_70[0x15])) + auStack_70[0x14] +
         auStack_168[local_16c + 1] + 0x5a827999;
    uVar2 = local_14 << 0x1e | local_14 >> 2;
    auStack_70[0x15] =
         (auStack_70[0x14] * 0x20 | auStack_70[0x14] >> 0x1b) +
         (uVar1 ^ auStack_70[0x13] & (uVar2 ^ uVar1)) + auStack_70[0x15] +
         auStack_168[local_16c + 2] + 0x5a827999;
    auStack_70[0x13] = auStack_70[0x13] * 0x40000000 | auStack_70[0x13] >> 2;
    local_18 = (auStack_70[0x15] * 0x20 | auStack_70[0x15] >> 0x1b) +
               (uVar2 ^ auStack_70[0x14] & (auStack_70[0x13] ^ uVar2)) + uVar1 +
               auStack_168[local_16c + 3] + 0x5a827999;
    auStack_70[0x14] = auStack_70[0x14] * 0x40000000 | auStack_70[0x14] >> 2;
    local_14 = (local_18 * 0x20 | local_18 >> 0x1b) +
               (auStack_70[0x13] ^ auStack_70[0x15] & (auStack_70[0x14] ^ auStack_70[0x13])) + uVar2
               + auStack_168[local_16c + 4] + 0x5a827999;
    auStack_70[0x15] = auStack_70[0x15] * 0x40000000 | auStack_70[0x15] >> 2;
  }
  for (; local_16c < 0x28; local_16c = local_16c + 5) {
    auStack_70[0x13] =
         (local_14 << 5 | local_14 >> 0x1b) + (local_18 ^ auStack_70[0x15] ^ auStack_70[0x14]) +
         auStack_70[0x13] + auStack_168[local_16c] + 0x6ed9eba1;
    uVar1 = local_18 << 0x1e | local_18 >> 2;
    auStack_70[0x14] =
         (auStack_70[0x13] * 0x20 | auStack_70[0x13] >> 0x1b) +
         (local_14 ^ uVar1 ^ auStack_70[0x15]) + auStack_70[0x14] + auStack_168[local_16c + 1] +
         0x6ed9eba1;
    uVar2 = local_14 << 0x1e | local_14 >> 2;
    auStack_70[0x15] =
         (auStack_70[0x14] * 0x20 | auStack_70[0x14] >> 0x1b) + (auStack_70[0x13] ^ uVar2 ^ uVar1) +
         auStack_70[0x15] + auStack_168[local_16c + 2] + 0x6ed9eba1;
    auStack_70[0x13] = auStack_70[0x13] * 0x40000000 | auStack_70[0x13] >> 2;
    local_18 = (auStack_70[0x15] * 0x20 | auStack_70[0x15] >> 0x1b) +
               (auStack_70[0x14] ^ auStack_70[0x13] ^ uVar2) + uVar1 + auStack_168[local_16c + 3] +
               0x6ed9eba1;
    auStack_70[0x14] = auStack_70[0x14] * 0x40000000 | auStack_70[0x14] >> 2;
    local_14 = (local_18 * 0x20 | local_18 >> 0x1b) +
               (auStack_70[0x15] ^ auStack_70[0x14] ^ auStack_70[0x13]) + uVar2 +
               auStack_168[local_16c + 4] + 0x6ed9eba1;
    auStack_70[0x15] = auStack_70[0x15] * 0x40000000 | auStack_70[0x15] >> 2;
  }
  for (; local_16c < 0x3c; local_16c = local_16c + 5) {
    iVar3 = (local_14 << 5 | local_14 >> 0x1b) +
            (local_18 & auStack_70[0x15] | auStack_70[0x14] & (local_18 | auStack_70[0x15])) +
            auStack_70[0x13] + auStack_168[local_16c];
    auStack_70[0x13] = iVar3 + 0x8f1bbcdc;
    uVar1 = local_18 << 0x1e | local_18 >> 2;
    iVar4 = (auStack_70[0x13] * 0x20 | auStack_70[0x13] >> 0x1b) +
            (local_14 & uVar1 | auStack_70[0x15] & (local_14 | uVar1)) + auStack_70[0x14] +
            auStack_168[local_16c + 1];
    auStack_70[0x14] = iVar4 + 0x8f1bbcdc;
    uVar2 = local_14 << 0x1e | local_14 >> 2;
    iVar5 = (auStack_70[0x14] * 0x20 | auStack_70[0x14] >> 0x1b) +
            (auStack_70[0x13] & uVar2 | uVar1 & (auStack_70[0x13] | uVar2)) + auStack_70[0x15] +
            auStack_168[local_16c + 2];
    auStack_70[0x15] = iVar5 + 0x8f1bbcdc;
    auStack_70[0x13] = iVar3 * 0x40000000 | auStack_70[0x13] >> 2;
    local_18 = (auStack_70[0x15] * 0x20 | auStack_70[0x15] >> 0x1b) +
               (auStack_70[0x14] & auStack_70[0x13] | uVar2 & (auStack_70[0x14] | auStack_70[0x13]))
               + uVar1 + auStack_168[local_16c + 3] + 0x8f1bbcdc;
    auStack_70[0x14] = iVar4 * 0x40000000 | auStack_70[0x14] >> 2;
    local_14 = (local_18 * 0x20 | local_18 >> 0x1b) +
               (auStack_70[0x15] & auStack_70[0x14] |
               auStack_70[0x13] & (auStack_70[0x15] | auStack_70[0x14])) + uVar2 +
               auStack_168[local_16c + 4] + 0x8f1bbcdc;
    auStack_70[0x15] = iVar5 * 0x40000000 | auStack_70[0x15] >> 2;
  }
  for (; local_16c < 0x50; local_16c = local_16c + 5) {
    auStack_70[0x13] =
         (local_14 << 5 | local_14 >> 0x1b) + (local_18 ^ auStack_70[0x15] ^ auStack_70[0x14]) +
         auStack_70[0x13] + auStack_168[local_16c] + 0xca62c1d6;
    uVar1 = local_18 << 0x1e | local_18 >> 2;
    auStack_70[0x14] =
         (auStack_70[0x13] * 0x20 | auStack_70[0x13] >> 0x1b) +
         (local_14 ^ uVar1 ^ auStack_70[0x15]) + auStack_70[0x14] + auStack_168[local_16c + 1] +
         0xca62c1d6;
    uVar2 = local_14 << 0x1e | local_14 >> 2;
    auStack_70[0x15] =
         (auStack_70[0x14] * 0x20 | auStack_70[0x14] >> 0x1b) + (auStack_70[0x13] ^ uVar2 ^ uVar1) +
         auStack_70[0x15] + auStack_168[local_16c + 2] + 0xca62c1d6;
    auStack_70[0x13] = auStack_70[0x13] * 0x40000000 | auStack_70[0x13] >> 2;
    local_18 = (auStack_70[0x15] * 0x20 | auStack_70[0x15] >> 0x1b) +
               (auStack_70[0x14] ^ auStack_70[0x13] ^ uVar2) + uVar1 + auStack_168[local_16c + 3] +
               0xca62c1d6;
    auStack_70[0x14] = auStack_70[0x14] * 0x40000000 | auStack_70[0x14] >> 2;
    local_14 = (local_18 * 0x20 | local_18 >> 0x1b) +
               (auStack_70[0x15] ^ auStack_70[0x14] ^ auStack_70[0x13]) + uVar2 +
               auStack_168[local_16c + 4] + 0xca62c1d6;
    auStack_70[0x15] = auStack_70[0x15] * 0x40000000 | auStack_70[0x15] >> 2;
  }
  *(uint *)(in_RDI + 8) = local_14 + *(int *)(in_RDI + 8);
  *(uint *)(in_RDI + 0xc) = local_18 + *(int *)(in_RDI + 0xc);
  *(uint *)(in_RDI + 0x10) = auStack_70[0x15] + *(int *)(in_RDI + 0x10);
  *(uint *)(in_RDI + 0x14) = auStack_70[0x14] + *(int *)(in_RDI + 0x14);
  *(uint *)(in_RDI + 0x18) = auStack_70[0x13] + *(int *)(in_RDI + 0x18);
  return;
}

Assistant:

static void csp_sha1_compress(csp_sha1_state_t * sha1, const uint8_t * buf) {

	uint32_t a, b, c, d, e, W[80], i;

	/* Copy the state into 512-bits into W[0..15] */
	for (i = 0; i < 16; i++)
		LOAD32H(W[i], buf + (4 * i));

	/* Copy state */
	a = sha1->state[0];
	b = sha1->state[1];
	c = sha1->state[2];
	d = sha1->state[3];
	e = sha1->state[4];

	/* Expand it */
	for (i = 16; i < 80; i++)
		W[i] = ROL(W[i - 3] ^ W[i - 8] ^ W[i - 14] ^ W[i - 16], 1);

	/* Compress */
	i = 0;

	/* Round one */
	for (; i < 20;) {
		FF_0(a, b, c, d, e, i++);
		FF_0(e, a, b, c, d, i++);
		FF_0(d, e, a, b, c, i++);
		FF_0(c, d, e, a, b, i++);
		FF_0(b, c, d, e, a, i++);
	}

	/* Round two */
	for (; i < 40;) {
		FF_1(a, b, c, d, e, i++);
		FF_1(e, a, b, c, d, i++);
		FF_1(d, e, a, b, c, i++);
		FF_1(c, d, e, a, b, i++);
		FF_1(b, c, d, e, a, i++);
	}

	/* Round three */
	for (; i < 60;) {
		FF_2(a, b, c, d, e, i++);
		FF_2(e, a, b, c, d, i++);
		FF_2(d, e, a, b, c, i++);
		FF_2(c, d, e, a, b, i++);
		FF_2(b, c, d, e, a, i++);
	}

	/* Round four */
	for (; i < 80;) {
		FF_3(a, b, c, d, e, i++);
		FF_3(e, a, b, c, d, i++);
		FF_3(d, e, a, b, c, i++);
		FF_3(c, d, e, a, b, i++);
		FF_3(b, c, d, e, a, i++);
	}

	/* Store */
	sha1->state[0] += a;
	sha1->state[1] += b;
	sha1->state[2] += c;
	sha1->state[3] += d;
	sha1->state[4] += e;
}